

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O1

int format_octal(int64_t v,char *p,int s)

{
  int iVar1;
  
  if (v < 0) {
    if (s < 1) {
      return -1;
    }
    iVar1 = 0x30;
  }
  else {
    p = p + s;
    if (0 < s) {
      iVar1 = s + 1;
      do {
        p[-1] = (byte)v & 7 | 0x30;
        p = p + -1;
        v = (ulong)v >> 3;
        iVar1 = iVar1 + -1;
      } while (1 < iVar1);
    }
    if (v == 0) {
      return 0;
    }
    if (s < 1) {
      return -1;
    }
    iVar1 = 0x37;
  }
  memset(p,iVar1,(ulong)(uint)s);
  return -1;
}

Assistant:

static int
format_octal(int64_t v, void *p, int digits)
{
	int64_t	max;
	int	ret;

	max = (((int64_t)1) << (digits * 3)) - 1;
	if (v >= 0  &&  v <= max) {
	    format_octal_recursive(v, (char *)p, digits);
	    ret = 0;
	} else {
	    format_octal_recursive(max, (char *)p, digits);
	    ret = -1;
	}
	return (ret);
}